

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::ColorEdit4(char *label,float *col,ImGuiColorEditFlags flags)

{
  undefined8 uVar1;
  ImGuiWindow *pIVar2;
  bool bVar3;
  int iVar4;
  ImU32 IVar5;
  char *pcVar6;
  ImGuiPayload *pIVar7;
  ImGuiPayload *pIVar8;
  ulong uVar9;
  ulong uVar10;
  char *p;
  undefined1 *p_data;
  ImVec4 *buf_00;
  uint flags_00;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  char **ppcVar15;
  uint uVar16;
  undefined8 *puVar18;
  ImGuiContext *pIVar19;
  bool bVar20;
  uint uVar21;
  uint uVar24;
  ImVec2 IVar22;
  uint uVar25;
  undefined1 auVar23 [16];
  float fVar26;
  float fVar27;
  float fVar28;
  char buf [64];
  undefined1 local_158 [4];
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  ImGuiWindow *local_140;
  float local_134;
  float local_130;
  uint local_12c;
  ulong local_128;
  ImVec2 local_120;
  float local_118;
  float local_114;
  float local_110;
  float local_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  char *local_f8;
  ImGuiWindow *local_f0;
  uint local_e8;
  uint local_e4;
  uint local_e0;
  float local_dc;
  undefined1 local_d8 [16];
  ImGuiContext *local_c0;
  ImVec2 local_b8;
  undefined8 uStack_b0;
  char *local_a0;
  float *local_98;
  ulong local_90;
  long local_88;
  long local_80;
  ImVec4 local_78 [4];
  ImVec2 local_38;
  uint uVar17;
  
  pIVar19 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->SkipItems == false) {
    local_118 = GetFrameHeight();
    local_114 = CalcItemWidth();
    local_d8 = ZEXT416(0);
    if ((flags & 0x10U) == 0) {
      local_d8 = ZEXT416((uint)((pIVar19->Style).ItemInnerSpacing.x + local_118));
    }
    pcVar6 = FindRenderedTextEnd(label,(char *)0x0);
    (pIVar19->NextItemData).Flags = 0;
    BeginGroup();
    PushID(label);
    uVar11 = flags & 0xff8ffff7U | 0x100008;
    if ((flags & 0x20U) == 0) {
      uVar11 = flags;
    }
    local_f8 = pcVar6;
    if ((uVar11 & 8) == 0) {
      ColorEditOptionsPopup(col,uVar11);
    }
    if ((uVar11 & 0x700000) == 0) {
      uVar11 = uVar11 | pIVar19->ColorEditOptions & 0x700000U;
    }
    if ((uVar11 & 0x1800000) == 0) {
      uVar11 = uVar11 | pIVar19->ColorEditOptions & 0x1800000U;
    }
    if ((uVar11 & 0x6000000) == 0) {
      uVar11 = uVar11 | pIVar19->ColorEditOptions & 0x6000000U;
    }
    local_140 = (ImGuiWindow *)CONCAT44(local_140._4_4_,uVar11);
    uVar14 = 0;
    if ((uVar11 & 0x18000000) == 0) {
      uVar14 = pIVar19->ColorEditOptions & 0x18000000;
    }
    uVar14 = uVar14 | uVar11;
    local_12c = pIVar19->ColorEditOptions & 0xe00fffffU | uVar14;
    uVar11 = local_12c & 2;
    if ((local_12c & 2) == 0) {
      fStack_14c = col[3];
    }
    else {
      fStack_14c = 1.0;
    }
    _local_158 = *(undefined1 (*) [12])col;
    local_e0 = uVar14 & 0x10100000;
    fVar27 = (float)*(undefined8 *)col;
    fVar26 = (float)((ulong)*(undefined8 *)col >> 0x20);
    local_f0 = pIVar2;
    local_e4 = flags;
    if (local_e0 == 0x10100000) {
      ColorConvertHSVtoRGB
                (fVar27,fVar26,col[2],(float *)local_158,(float *)(local_158 + 4),
                 (float *)(local_158 + 8));
    }
    else if ((~uVar14 & 0x8200000) == 0) {
      ColorConvertRGBtoHSV
                (fVar27,fVar26,col[2],(float *)local_158,(float *)(local_158 + 4),
                 (float *)(local_158 + 8));
      ColorEditRestoreHS(col,(float *)local_158,(float *)(local_158 + 4),(float *)(local_158 + 8));
    }
    flags_00 = local_12c;
    uVar21 = (uint)((float)local_158 * 255.0 +
                   (float)(-(uint)(0.0 <= (float)local_158) & 0x3f000000 |
                          ~-(uint)(0.0 <= (float)local_158) & 0xbf000000));
    uVar24 = (uint)(fStack_154 * 255.0 +
                   (float)(-(uint)(0.0 <= fStack_154) & 0x3f000000 |
                          ~-(uint)(0.0 <= fStack_154) & 0xbf000000));
    uVar25 = (uint)(fStack_150 * 255.0 +
                   (float)(-(uint)(0.0 <= fStack_150) & 0x3f000000 |
                          ~-(uint)(0.0 <= fStack_150) & 0xbf000000));
    local_108 = CONCAT44(uVar24,uVar21);
    uStack_100 = CONCAT44((int)(fStack_14c * 255.0 +
                               (float)(-(uint)(0.0 <= fStack_14c) & 0x3f000000 |
                                      ~-(uint)(0.0 <= fStack_14c) & 0xbf000000)),uVar25);
    local_b8 = (local_f0->DC).CursorPos;
    uStack_b0 = 0;
    fVar27 = (float)local_d8._0_4_;
    if ((pIVar19->Style).ColorButtonPosition != 0) {
      fVar27 = 0.0;
    }
    local_134 = local_114 - (float)local_d8._0_4_;
    uVar17 = (uint)(uVar11 == 0);
    uVar16 = uVar17 + 3;
    local_90 = (ulong)uVar16;
    (local_f0->DC).CursorPos.x = fVar27 + local_b8.x;
    uVar11 = (uint)local_140;
    if ((((ulong)local_140 & 0x300000) == 0) || ((local_12c & 0x20) != 0)) {
      local_128 = 0;
      if (((uint)local_140 >> 0x16 & 1) == 0) {
        bVar20 = false;
      }
      else {
        bVar20 = false;
        if ((local_12c & 0x20) == 0) {
          if (0xfe < (int)uVar21) {
            uVar21 = 0xff;
          }
          uVar10 = 0;
          uVar9 = (ulong)uVar21;
          if ((int)uVar21 < 1) {
            uVar9 = uVar10;
          }
          if (0xfe < (int)uVar24) {
            uVar24 = 0xff;
          }
          uVar12 = (ulong)uVar24;
          if ((int)uVar24 < 1) {
            uVar12 = uVar10;
          }
          if (0xfe < (int)uVar25) {
            uVar25 = 0xff;
          }
          uVar13 = (ulong)uVar25;
          if ((int)uVar25 < 1) {
            uVar13 = uVar10;
          }
          if ((local_12c & 2) == 0) {
            pcVar6 = "#%02X%02X%02X%02X";
          }
          else {
            pcVar6 = "#%02X%02X%02X";
          }
          ImFormatString((char *)local_78,0x40,pcVar6,uVar9,uVar12,uVar13);
          SetNextItemWidth(local_134);
          local_120.x = 0.0;
          local_120.y = 0.0;
          bVar20 = false;
          buf_00 = local_78;
          bVar3 = InputTextEx("##Text",(char *)0x0,(char *)buf_00,0x40,&local_120,6,
                              (ImGuiInputTextCallback)0x0,(void *)0x0);
          if (bVar3) {
            while (((ulong)*(byte *)&buf_00->x < 0x24 &&
                   ((0x900000200U >> ((ulong)*(byte *)&buf_00->x & 0x3f) & 1) != 0))) {
              buf_00 = (ImVec4 *)((long)&buf_00->x + 1);
            }
            local_108 = 0;
            uStack_100 = 0xff00000000;
            if ((flags_00 & 2) == 0) {
              __isoc99_sscanf(buf_00,"%02X%02X%02X%02X",&local_108,(long)&local_108 + 4,&uStack_100,
                              (long)&uStack_100 + 4);
            }
            else {
              __isoc99_sscanf(buf_00,"%02X%02X%02X",&local_108,(long)&local_108 + 4,&uStack_100,
                              (long)&uStack_100 + 4);
            }
            bVar20 = true;
          }
          if ((flags_00 & 8) == 0) {
            OpenPopupOnItemClick("context",1);
          }
          local_128 = 0;
        }
      }
    }
    else {
      local_c0 = pIVar19;
      fVar27 = (pIVar19->Style).ItemInnerSpacing.x;
      pcVar6 = "M:0.000";
      if (((uint)local_140 >> 0x18 & 1) == 0) {
        pcVar6 = "M:000";
      }
      local_e8 = uVar14;
      local_a0 = label;
      local_98 = col;
      IVar22 = CalcTextSize(pcVar6,(char *)0x0,false,-1.0);
      iVar4 = ((uVar11 >> 0x15 & 1) != 0) + 1;
      bVar20 = (flags_00 >> 0x13 & 1) != 0;
      fVar26 = (float)(uVar17 + 2);
      fVar28 = (float)(int)((local_134 - fVar27 * fVar26) / (float)uVar16);
      local_10c = 1.0;
      if (1.0 <= fVar28) {
        local_10c = fVar28;
      }
      fVar27 = (float)(int)(local_134 - (fVar27 + local_10c) * fVar26);
      local_110 = 1.0;
      if (bVar20) {
        local_110 = 0.0;
      }
      local_dc = 3.57331e-43;
      if (bVar20) {
        local_dc = 0.0;
      }
      local_130 = 1.0;
      if (1.0 <= fVar27) {
        local_130 = fVar27;
      }
      if (local_10c <= IVar22.x) {
        iVar4 = 0;
      }
      local_80 = (long)ColorEdit4::fmt_table_int[0] + (ulong)(uint)(iVar4 << 5);
      local_88 = (long)ColorEdit4::fmt_table_float[0] + (ulong)(uint)(iVar4 << 5);
      puVar18 = &local_108;
      ppcVar15 = ColorEdit4::ids;
      p_data = local_158;
      bVar20 = false;
      local_128 = 0;
      uVar9 = 1;
      do {
        if (uVar9 != 1) {
          SameLine(0.0,(local_c0->Style).ItemInnerSpacing.x);
        }
        fVar27 = local_10c;
        if (uVar16 <= uVar9) {
          fVar27 = local_130;
        }
        SetNextItemWidth(fVar27);
        if (((uint)local_140 >> 0x18 & 1) == 0) {
          local_78[0]._0_8_ = (ulong)(uint)local_78[0].y << 0x20;
          local_120.x = local_dc;
          bVar3 = DragScalar(*ppcVar15,4,puVar18,1.0,local_78,&local_120,
                             *(char **)(local_80 + -8 + uVar9 * 8),0);
          bVar20 = (bool)(bVar20 | bVar3);
        }
        else {
          local_78[0]._0_8_ = (ulong)(uint)local_78[0].y << 0x20;
          local_120.x = local_110;
          bVar3 = DragScalar(*ppcVar15,8,p_data,0.003921569,local_78,&local_120,
                             *(char **)(local_88 + -8 + uVar9 * 8),0);
          bVar20 = (bool)(bVar20 | bVar3);
          local_128 = CONCAT71((int7)(local_128 >> 8),(byte)local_128 | bVar20);
        }
        if ((local_12c & 8) == 0) {
          OpenPopupOnItemClick("context",1);
        }
        puVar18 = (undefined8 *)((long)puVar18 + 4);
        ppcVar15 = ppcVar15 + 1;
        p_data = p_data + 4;
        bVar3 = uVar9 != uVar16;
        label = local_a0;
        uVar9 = uVar9 + 1;
        col = local_98;
        pIVar19 = local_c0;
        uVar14 = local_e8;
        flags_00 = local_12c;
      } while (bVar3);
    }
    if ((flags_00 & 0x10) == 0) {
      fVar27 = 0.0;
      if (((flags_00 & 0x20) == 0) && ((pIVar19->Style).ColorButtonPosition != 0)) {
        fVar27 = local_134 + (pIVar19->Style).ItemInnerSpacing.x;
      }
      (local_f0->DC).CursorPos.x = fVar27 + local_b8.x;
      (local_f0->DC).CursorPos.y = local_b8.y;
      local_78[0]._0_8_ = *(undefined8 *)col;
      local_78[0].z = col[2];
      if ((flags_00 & 2) == 0) {
        local_78[0].w = col[3];
      }
      else {
        local_78[0].w = 1.0;
      }
      bVar3 = ColorButton("##ColorButton",local_78,flags_00,(ImVec2)0x0);
      if (((flags_00 & 4) == 0) && (bVar3)) {
        (pIVar19->ColorPickerRef).x = local_78[0].x;
        (pIVar19->ColorPickerRef).y = local_78[0].y;
        (pIVar19->ColorPickerRef).z = local_78[0].z;
        (pIVar19->ColorPickerRef).w = local_78[0].w;
        OpenPopup("picker",0);
        local_120.y = (pIVar19->Style).ItemSpacing.y + (pIVar19->LastItemData).Rect.Max.y;
        local_120.x = (pIVar19->LastItemData).Rect.Min.x + 0.0;
        local_38.x = 0.0;
        local_38.y = 0.0;
        SetNextWindowPos(&local_120,0,&local_38);
      }
      if ((flags_00 & 8) == 0) {
        OpenPopupOnItemClick("context",1);
      }
      local_140 = (ImGuiWindow *)0x0;
      bVar3 = BeginPopup("picker",0);
      if (bVar3) {
        local_140 = pIVar19->CurrentWindow;
        if (local_f8 != label) {
          TextEx(label,local_f8,0);
          Spacing();
        }
        uVar11 = local_e4 & 0x1f890002;
        SetNextItemWidth(local_118 * 12.0);
        bVar3 = ColorPicker4("##picker",col,uVar11 | 0x740080,&(pIVar19->ColorPickerRef).x);
        bVar20 = (bool)(bVar20 | bVar3);
        EndPopup();
      }
    }
    else {
      local_140 = (ImGuiWindow *)0x0;
    }
    if ((local_f8 != label) && ((flags_00 & 0x80) == 0)) {
      if ((flags_00 & 0x20) == 0) {
        local_d8 = ZEXT416((uint)(local_114 + (pIVar19->Style).ItemInnerSpacing.x));
      }
      IVar22.x = local_b8.x + (float)local_d8._0_4_;
      IVar22.y = local_b8.y + (pIVar19->Style).FramePadding.y;
      (local_f0->DC).CursorPos = IVar22;
      TextEx(label,local_f8,0);
    }
    if ((bVar20 != false) && (local_140 == (ImGuiWindow *)0x0)) {
      if ((local_128 & 1) == 0) {
        auVar23._0_4_ = (float)(int)local_108;
        auVar23._4_4_ = (float)local_108._4_4_;
        auVar23._8_4_ = (float)(int)uStack_100;
        auVar23._12_4_ = (float)uStack_100._4_4_;
        _local_158 = divps(auVar23,_DAT_00192120);
      }
      auVar23 = _local_158;
      fVar27 = fStack_150;
      if ((~uVar14 & 0x8200000) == 0) {
        pIVar19->ColorEditLastHue = (float)local_158;
        pIVar19->ColorEditLastSat = fStack_154;
        _local_158 = auVar23;
        ColorConvertHSVtoRGB
                  (auVar23._0_4_,auVar23._4_4_,fVar27,(float *)local_158,(float *)(local_158 + 4),
                   (float *)(local_158 + 8));
        auVar23 = _local_158;
        local_78[0].x = (float)local_158;
        local_78[0].y = fStack_154;
        local_78[0].z = fStack_150;
        local_78[0].w = 0.0;
        _local_158 = auVar23;
        IVar5 = ColorConvertFloat4ToU32(local_78);
        pIVar19->ColorEditLastColor = IVar5;
      }
      fVar27 = fStack_150;
      uVar1 = _local_158;
      if (local_e0 == 0x10100000) {
        ColorConvertRGBtoHSV
                  ((float)_local_158,(float)((ulong)_local_158 >> 0x20),fStack_150,
                   (float *)local_158,(float *)(local_158 + 4),(float *)(local_158 + 8));
        fVar27 = fStack_150;
        uVar1 = _local_158;
      }
      *(undefined8 *)col = uVar1;
      col[2] = fVar27;
      if ((flags_00 & 2) == 0) {
        col[3] = fStack_14c;
      }
    }
    PopID();
    EndGroup();
    if ((((flags_00 >> 9 & 1) == 0) && (((pIVar19->LastItemData).StatusFlags & 1U) != 0)) &&
       (bVar3 = BeginDragDropTarget(), bVar3)) {
      pIVar7 = AcceptDragDropPayload("_COL3F",0);
      if (pIVar7 != (ImGuiPayload *)0x0) {
        puVar18 = (undefined8 *)pIVar7->Data;
        col[2] = *(float *)(puVar18 + 1);
        *(undefined8 *)col = *puVar18;
        bVar20 = true;
      }
      pIVar8 = AcceptDragDropPayload("_COL4F",0);
      if (pIVar8 != (ImGuiPayload *)0x0) {
        memcpy(col,pIVar8->Data,(ulong)(uint)((int)local_90 << 2));
        bVar20 = true;
      }
      if ((pIVar8 != (ImGuiPayload *)0x0 || pIVar7 != (ImGuiPayload *)0x0) &&
          (uVar14 >> 0x1c & 1) != 0) {
        ColorConvertRGBtoHSV(*col,col[1],col[2],col,col + 1,col + 2);
      }
      EndDragDropTarget();
    }
    if (((local_140 != (ImGuiWindow *)0x0) && (pIVar19->ActiveId != 0)) &&
       (pIVar19->ActiveIdWindow == local_140)) {
      (pIVar19->LastItemData).ID = pIVar19->ActiveId;
    }
    if (bVar20 != false) {
      MarkItemEdited((pIVar19->LastItemData).ID);
    }
  }
  else {
    bVar20 = false;
  }
  return bVar20;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}